

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

qsizetype QtPrivate::lastIndexOf
                    (QStringView haystack,qsizetype from,char16_t needle,CaseSensitivity cs)

{
  QStringView haystack_00;
  qsizetype qVar1;
  char16_t in_CX;
  storage_type_conflict *in_RSI;
  qsizetype in_RDI;
  long in_FS_OFFSET;
  CaseSensitivity in_stack_ffffffffffffffd4;
  qsizetype qVar2;
  
  qVar2 = *(qsizetype *)(in_FS_OFFSET + 0x28);
  qVar1 = in_RDI;
  QChar::QChar<char16_t,_true>((QChar *)&stack0xffffffffffffffd6,in_CX);
  haystack_00.m_size = qVar2;
  haystack_00.m_data = in_RSI;
  qVar1 = anon_unknown.dwarf_2b2524::qLastIndexOf<QStringView>
                    (haystack_00,(QChar)(char16_t)((ulong)qVar1 >> 0x30),in_RDI,
                     in_stack_ffffffffffffffd4);
  if (*(long *)(in_FS_OFFSET + 0x28) == qVar2) {
    return qVar1;
  }
  __stack_chk_fail();
}

Assistant:

qsizetype QtPrivate::lastIndexOf(QStringView haystack, qsizetype from, char16_t needle, Qt::CaseSensitivity cs) noexcept
{
    return qLastIndexOf(haystack, QChar(needle), from, cs);
}